

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

opj_bool tcd_init_v2(opj_tcd_v2_t *p_tcd,opj_image_t *p_image,opj_cp_v2_t *p_cp)

{
  OPJ_UINT32 OVar1;
  opj_tcd_image_v2_t *poVar2;
  opj_tcd_tile_v2_t *__s;
  opj_tcd_tilecomp_v2_t *__s_00;
  opj_bool oVar3;
  ulong __size;
  
  p_tcd->image = p_image;
  p_tcd->cp = p_cp;
  __s = (opj_tcd_tile_v2_t *)malloc(0x358);
  poVar2 = p_tcd->tcd_image;
  poVar2->tiles = __s;
  oVar3 = 0;
  if (__s != (opj_tcd_tile_v2_t *)0x0) {
    memset(__s,0,0x358);
    OVar1 = p_image->numcomps;
    __size = (ulong)(OVar1 * 0x38);
    __s_00 = (opj_tcd_tilecomp_v2_t *)malloc(__size);
    poVar2->tiles->comps = __s_00;
    oVar3 = 0;
    if (__s_00 != (opj_tcd_tilecomp_v2_t *)0x0) {
      memset(__s_00,0,__size);
      poVar2->tiles->numcomps = OVar1;
      p_tcd->tp_pos = (p_cp->m_specific_param).m_enc.m_tp_pos;
      oVar3 = 1;
    }
  }
  return oVar3;
}

Assistant:

opj_bool tcd_init_v2(  opj_tcd_v2_t *p_tcd,
					   opj_image_t * p_image,
					   opj_cp_v2_t * p_cp )
{
	OPJ_UINT32 l_tile_comp_size;

	p_tcd->image = p_image;
	p_tcd->cp = p_cp;

	p_tcd->tcd_image->tiles = (opj_tcd_tile_v2_t *) opj_malloc(sizeof(opj_tcd_tile_v2_t));
	if (! p_tcd->tcd_image->tiles) {
		return OPJ_FALSE;
	}
	memset(p_tcd->tcd_image->tiles,0, sizeof(opj_tcd_tile_v2_t));

	l_tile_comp_size = p_image->numcomps * sizeof(opj_tcd_tilecomp_v2_t);
	p_tcd->tcd_image->tiles->comps = (opj_tcd_tilecomp_v2_t *) opj_malloc(l_tile_comp_size);
	if (! p_tcd->tcd_image->tiles->comps ) {
		return OPJ_FALSE;
	}
	memset( p_tcd->tcd_image->tiles->comps , 0 , l_tile_comp_size);

	p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
	p_tcd->tp_pos = p_cp->m_specific_param.m_enc.m_tp_pos;

	return OPJ_TRUE;
}